

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.cpp
# Opt level: O3

bool vera::loadSTL(string *_filename,Mesh *_mesh)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  bool bVar8;
  double vd [3];
  double nd [3];
  char solid [80];
  Triangle tri_1;
  char header [80];
  vec3 n;
  uint num_tri;
  char buf [4];
  vector<vera::Triangle,_std::allocator<vera::Triangle>_> triangles;
  unsigned_short att_count;
  char header_1 [80];
  double *local_3208;
  double dStack_3200;
  double local_31f8 [2];
  vec3 local_31e8;
  double local_31d8;
  double dStack_31d0;
  double local_31c8;
  ulong local_31c0;
  vec3 local_31b8;
  undefined1 *local_31a8 [2];
  undefined1 local_3198 [16];
  undefined8 local_3188;
  undefined8 uStack_3180;
  undefined8 local_3178;
  undefined8 uStack_3170;
  undefined8 local_3168;
  undefined8 uStack_3160;
  undefined8 local_3158;
  undefined8 uStack_3150;
  undefined8 local_3148;
  undefined8 uStack_3140;
  Triangle local_3138;
  undefined1 local_3088 [80];
  vec3 local_3038;
  undefined1 local_3028 [2032];
  undefined1 *local_2838 [2];
  undefined1 local_2828 [2032];
  undefined1 local_2038 [2048];
  vector<vera::Triangle,_std::allocator<vera::Triangle>_> local_1838 [85];
  vec3 local_1038;
  undefined1 local_1028 [2032];
  char local_838 [2056];
  
  __stream = fopen((_filename->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    loadSTL((vera *)_filename);
    return false;
  }
  local_3148 = 0;
  uStack_3140 = 0;
  local_3158 = 0;
  uStack_3150 = 0;
  local_3168 = 0;
  uStack_3160 = 0;
  local_3178 = 0;
  uStack_3170 = 0;
  local_3188 = 0;
  uStack_3180 = 0;
  sVar3 = fread(local_3088,1,0x50,__stream);
  if (sVar3 == 0x50) {
    __isoc99_sscanf(local_3088,"%79s",&local_3188);
    local_2038._0_8_ = local_2038 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2038,"solid","");
    iVar1 = std::__cxx11::string::compare((char *)local_2038);
    if ((undefined1 *)local_2038._0_8_ != local_2038 + 0x10) {
      operator_delete((void *)local_2038._0_8_);
    }
    if (iVar1 == 0) {
      sVar3 = fread(local_2038,1,4,__stream);
      if (sVar3 != 4) {
        pcVar6 = "IOError: too short (3).";
        goto LAB_002b1107;
      }
      uVar7 = local_2038._0_8_ & 0xffffffff;
      fseek(__stream,0,2);
      lVar4 = ftell(__stream);
      if ((long)(int)lVar4 == uVar7 * 0x32 + 0x54) goto LAB_002b0f96;
      fseek(__stream,0,0);
      pcVar6 = fgets(local_2038,0x800,__stream);
      if (pcVar6 != (char *)0x0) {
LAB_002b1199:
        Triangle::Triangle(&local_3138);
        iVar1 = __isoc99_fscanf(__stream,"%s %s %lg %lg %lg",local_838,local_1838,&local_31d8,
                                &dStack_31d0,&local_31c8);
        local_31e8.field_2.z = (float)local_31c8;
        local_31e8.field_1.y = (float)dStack_31d0;
        local_31e8.field_0.x = (float)local_31d8;
        local_3038._0_8_ = local_3028;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3038,"endsolid","");
        iVar2 = std::__cxx11::string::compare((char *)&local_3038);
        if ((undefined1 *)local_3038._0_8_ != local_3028) {
          operator_delete((void *)local_3038._0_8_);
        }
        if (iVar2 != 0) {
          if (iVar1 == 5) {
            local_3038._0_8_ = local_3028;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3038,"facet","");
            iVar1 = std::__cxx11::string::compare((char *)&local_3038);
            if (iVar1 == 0) {
LAB_002b12e7:
              local_1038._0_8_ = local_1028;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1038,"normal","");
              iVar2 = std::__cxx11::string::compare((char *)&local_1038);
              bVar8 = iVar2 != 0;
              if ((undefined1 *)local_1038._0_8_ != local_1028) {
                operator_delete((void *)local_1038._0_8_);
              }
              if (iVar1 != 0) goto LAB_002b1342;
            }
            else {
              local_31a8[0] = local_3198;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_31a8,"faced","");
              iVar2 = std::__cxx11::string::compare((char *)local_31a8);
              bVar8 = true;
              if (iVar2 == 0) goto LAB_002b12e7;
LAB_002b1342:
              if (local_31a8[0] != local_3198) {
                operator_delete(local_31a8[0]);
              }
            }
            if ((undefined1 *)local_3038._0_8_ != local_3028) {
              operator_delete((void *)local_3038._0_8_);
            }
            if (!bVar8) {
              local_31e8.field_1.y = (float)dStack_31d0;
              local_31e8.field_0.x = (float)local_31d8;
              local_31e8.field_2.z = (float)local_31c8;
              Triangle::setNormals(&local_3138,&local_31e8,&local_31e8,&local_31e8);
              iVar1 = __isoc99_fscanf(__stream,"%s %s",&local_3038,&local_1038);
              if (iVar1 == 2) {
                local_2838[0] = local_2828;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_2838,"outer","");
                iVar1 = std::__cxx11::string::compare((char *)local_2838);
                bVar8 = true;
                if (iVar1 == 0) {
                  local_3208 = local_31f8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3208,"loop","");
                  iVar1 = std::__cxx11::string::compare((char *)&local_3208);
                  bVar8 = iVar1 != 0;
                  if (local_3208 != local_31f8) {
                    operator_delete(local_3208);
                  }
                }
                if (local_2838[0] != local_2828) {
                  operator_delete(local_2838[0]);
                }
                if (!bVar8) {
                  sVar5 = 0;
                  do {
                    iVar1 = __isoc99_fscanf(__stream,"%s",local_2838);
                    if (iVar1 != 1) {
LAB_002b174f:
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"IOError: bad format (4).",0x18);
                      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
                      std::ostream::put(-0x60);
                      std::ostream::flush();
                      goto LAB_002b198e;
                    }
                    local_3208 = local_31f8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_3208,"endloop","");
                    iVar1 = std::__cxx11::string::compare((char *)&local_3208);
                    if (local_3208 != local_31f8) {
                      operator_delete(local_3208);
                    }
                    if (iVar1 == 0) goto LAB_002b15a9;
                    local_3208 = local_31f8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_3208,"vertex","");
                    iVar1 = std::__cxx11::string::compare((char *)&local_3208);
                    if (local_3208 != local_31f8) {
                      operator_delete(local_3208);
                    }
                    if (iVar1 != 0) goto LAB_002b174f;
                    iVar1 = __isoc99_fscanf(__stream,"%lg %lg %lg",&local_3208,&dStack_3200,
                                            local_31f8);
                    if (iVar1 != 3) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"IOError: bad format (3).",0x18);
                      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
                      std::ostream::put(-0x60);
                      std::ostream::flush();
                      goto LAB_002b198e;
                    }
                    local_31b8.field_1.y = (float)dStack_3200;
                    local_31b8.field_0.x = (float)(double)local_3208;
                    local_31b8.field_2.z = (float)local_31f8[0];
                    Triangle::setVertex(&local_3138,sVar5,&local_31b8);
                    sVar5 = sVar5 + 1;
                  } while( true );
                }
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"IOError: bad format (2). ",0x19);
              std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
              std::ostream::put(-0x60);
              std::ostream::flush();
              goto LAB_002b198e;
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"facet: ",7);
          sVar3 = strlen(local_838);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_838,sVar3);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
          std::ostream::put(-0x28);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"normal: ",8);
          sVar3 = strlen((char *)local_1838);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)local_1838,sVar3);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
          std::ostream::put(-0x28);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"IOError: bad format (1).",0x18);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
          std::ostream::put(-0x60);
          std::ostream::flush();
          goto LAB_002b198e;
        }
        Triangle::~Triangle(&local_3138);
        goto LAB_002b10f1;
      }
      pcVar6 = "IOError: ascii too short (2).";
      lVar4 = 0x1d;
    }
    else {
LAB_002b0f96:
      fseek(__stream,0,0);
      sVar3 = fread(local_838,1,0x50,__stream);
      if (sVar3 == 0x50) {
        sVar3 = fread(local_2838,4,1,__stream);
        if (sVar3 == 1) {
          local_1838[0].super__Vector_base<vera::Triangle,_std::allocator<vera::Triangle>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_1838[0].super__Vector_base<vera::Triangle,_std::allocator<vera::Triangle>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1838[0].super__Vector_base<vera::Triangle,_std::allocator<vera::Triangle>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          iVar1 = (int)local_2838[0];
          uVar7 = (ulong)local_2838[0] & 0xffffffff;
          std::vector<vera::Triangle,_std::allocator<vera::Triangle>_>::resize(local_1838,uVar7);
          local_31c0 = uVar7;
          if (0 < iVar1) {
            iVar1 = 0;
            do {
              Triangle::Triangle((Triangle *)local_2038);
              sVar3 = fread(&local_3038,4,3,__stream);
              if (sVar3 != 3) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"IOError: bad format (8).",0x18);
                std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
                std::ostream::put(-0x60);
                std::ostream::flush();
LAB_002b1718:
                Triangle::~Triangle((Triangle *)local_2038);
                std::vector<vera::Triangle,_std::allocator<vera::Triangle>_>::~vector(local_1838);
                goto LAB_002b16a8;
              }
              Triangle::setNormals((Triangle *)local_2038,&local_3038,&local_3038,&local_3038);
              sVar5 = 0;
              do {
                sVar3 = fread(&local_1038,4,3,__stream);
                if (sVar3 != 3) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"IOError: bad format (9).",0x18);
                  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
                  std::ostream::put(-0x60);
                  std::ostream::flush();
                  goto LAB_002b1718;
                }
                Triangle::setVertex((Triangle *)local_2038,sVar5,&local_1038);
                sVar5 = sVar5 + 1;
              } while (sVar5 != 3);
              sVar3 = fread(&local_1038,2,1,__stream);
              if (sVar3 != 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"IOError: bad format (10).",0x19);
                std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
                std::ostream::put(-0x60);
                std::ostream::flush();
                goto LAB_002b1718;
              }
              Triangle::~Triangle((Triangle *)local_2038);
              iVar1 = iVar1 + 1;
            } while (iVar1 != (int)local_31c0);
          }
          std::vector<vera::Triangle,_std::allocator<vera::Triangle>_>::~vector(local_1838);
LAB_002b10f1:
          bVar8 = true;
          goto LAB_002b16aa;
        }
        pcVar6 = "IOError: bad format (7).";
      }
      else {
        pcVar6 = "IOError: bad format (6).";
      }
      lVar4 = 0x18;
    }
  }
  else {
    pcVar6 = "IOError: too short (1).";
LAB_002b1107:
    lVar4 = 0x17;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,lVar4);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  goto LAB_002b16a8;
LAB_002b15a9:
  Mesh::addTriangle(_mesh,&local_3138);
  iVar1 = __isoc99_fscanf(__stream,"%s",local_2838);
  if (iVar1 != 1) goto LAB_002b19fd;
  local_3208 = local_31f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3208,"endfacet","");
  iVar1 = std::__cxx11::string::compare((char *)&local_3208);
  if (local_3208 != local_31f8) {
    operator_delete(local_3208);
  }
  if (iVar1 != 0) goto LAB_002b19fd;
  Triangle::~Triangle(&local_3138);
  goto LAB_002b1199;
LAB_002b19fd:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"IOError: bad format (5).",0x18);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
LAB_002b198e:
  Triangle::~Triangle(&local_3138);
LAB_002b16a8:
  bVar8 = false;
LAB_002b16aa:
  fclose(__stream);
  return bVar8;
}

Assistant:

bool loadSTL( const std::string& _filename, Mesh& _mesh ) {
    FILE * stl_file = fopen(_filename.c_str(),"rb");
    if (NULL == stl_file) {
        fprintf(stderr,"IOError: %s could not be opened...\n", _filename.c_str());
        return false;
    }

     // Specifically 80 character header
    char header[80];
    char solid[80] = {0};
    bool is_ascii = true;
    if (fread(header, 1, 80, stl_file) != 80) {
        std::cerr << "IOError: too short (1)." << std::endl;
        goto close_false;
    }
    sscanf(header, "%79s", solid);
  
    if ( std::string("solid") != solid) 
        is_ascii = false;
    else {
        // might still be binary
        char buf[4];
        if ( fread(buf, 1, 4, stl_file) != 4) {
            std::cerr << "IOError: too short (3)." << std::endl;
            goto close_false;
        }
    
        size_t num_faces = *reinterpret_cast<unsigned int*>(buf);
        fseek(stl_file,0,SEEK_END);
        int file_size = ftell(stl_file);
        if (file_size == 80 + 4 + (4*12 + 2) * num_faces) is_ascii = false;
        else is_ascii = true;
    }

    if (is_ascii) {
        // Rewind to end of header
        //stl_file = fopen(filename.c_str(),"r");
        //stl_file = freopen(NULL,"r",stl_file);
        fseek(stl_file, 0, SEEK_SET);
        if (NULL == stl_file) {
            fprintf(stderr,"IOError: stl file could not be reopened as ascii ...\n");
            return false;
        }
        // Read 80 header
        // Eat file name

        char name[LINE_MAX];
        if ( NULL == fgets(name, LINE_MAX, stl_file)) {
            std::cerr << "IOError: ascii too short (2)." << std::endl;
            goto close_false;
        }

        // ascii
        while(true) {
            int ret;
            char facet[LINE_MAX];
            char normal[LINE_MAX];

            Triangle tri;
            glm::vec3 n;

            double nd[3];
            ret = fscanf(stl_file,"%s %s %lg %lg %lg", facet, normal, nd, nd+1, nd+2);
            n.x = nd[0];
            n.y = nd[1];
            n.z = nd[2];

            if (std::string("endsolid") == facet)
                break;
            
            if (ret != 5 || 
                !(  std::string("facet") == facet || 
                    std::string("faced") == facet) ||
                    std::string("normal") != normal) {
                std::cout << "facet: " << facet << std::endl;
                std::cout << "normal: " <<normal << std::endl;
                std::cerr << "IOError: bad format (1)." << std::endl;
                goto close_false;
            }
            // copy casts to Type
            n.x = nd[0]; 
            n.y = nd[1];
            n.z = nd[2];
            tri.setNormals(n, n, n);
            char outer[LINE_MAX], loop[LINE_MAX];
            ret = fscanf(stl_file,"%s %s",outer,loop);
            if (ret != 2 || std::string("outer") != outer || std::string("loop") != loop) {
                std::cerr << "IOError: bad format (2). " << std::endl;
                goto close_false;
            }
            
            size_t index = 0;
            while(true) {
                char word[LINE_MAX];
                int ret = fscanf(stl_file, "%s", word);
                if (ret == 1 && std::string("endloop") == word)
                    break;
                else if (ret == 1 && std::string("vertex") == word) {
                    glm::vec3 v;
                    double vd[3];
                    int ret = fscanf(stl_file, "%lg %lg %lg", vd, vd+1, vd+2);
                    if (ret != 3) {
                        std::cerr << "IOError: bad format (3)." << std::endl;
                        goto close_false;
                    }
                    tri.setVertex(index, glm::vec3(vd[0], vd[1], vd[2]));
                    index++;
                }
                else {
                    std::cerr << "IOError: bad format (4)." << std::endl;
                    goto close_false;
                }
            }
            _mesh.addTriangle(tri);

            char endfacet[LINE_MAX];
            ret = fscanf(stl_file,"%s",endfacet);
            if (ret != 1 || std::string("endfacet") != endfacet) {
                std::cerr << "IOError: bad format (5)." << std::endl;
                goto close_false;
            }
        }
        // read endfacet
        goto close_true;
    }
    else {
        // Binary
        // stl_file = freopen(NULL,"rb",stl_file);
        fseek(stl_file, 0, SEEK_SET);
        // Read 80 header
        char header[80];
        if (fread(header, sizeof(char), 80, stl_file) != 80) {
            std::cerr << "IOError: bad format (6)." << std::endl;
            goto close_false;
        }
        // Read number of triangles
        unsigned int num_tri;
        if (fread(&num_tri, sizeof(unsigned int), 1, stl_file) != 1) {
            std::cerr << "IOError: bad format (7)." << std::endl;
            goto close_false;
        }

        std::vector<Triangle> triangles;
        triangles.resize(num_tri);
        for(int t = 0; t < (int)num_tri; t++) {
            Triangle tri;

            // Read normal
            glm::vec3 n;
            if (fread(&n.x, sizeof(float), 3, stl_file) != 3) {
                std::cerr << "IOError: bad format (8)." << std::endl;
                goto close_false;
            }
            tri.setNormals(n, n, n);

            // Read each vertex
            for (size_t c = 0; c < 3; c++) {
                glm::vec3 v;
                if (fread (&v.x, sizeof(float), 3, stl_file) != 3) {
                    std::cerr << "IOError: bad format (9)." << std::endl;
                    goto close_false;
                }
                tri.setVertex(c, v);
            }
            
            // Read attribute size
            unsigned short att_count;
            if (fread(&att_count, sizeof(unsigned short), 1, stl_file) != 1) {
                std::cerr << "IOError: bad format (10)." << std::endl;
                goto close_false;
            }
        }
        goto close_true;
    }

    close_false:
        fclose(stl_file);
        return false;
    close_true:
        fclose(stl_file);
        return true;
}